

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall duckdb_parquet::TimestampType::printTo(TimestampType *this,ostream *out)

{
  ostream *poVar1;
  ostream *in_RSI;
  TimeUnit *in_stack_00000118;
  string local_60 [48];
  string local_30 [32];
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"TimestampType(");
  poVar1 = std::operator<<(local_10,"isAdjustedToUTC=");
  duckdb_apache::thrift::to_string<bool>((bool *)in_stack_00000118);
  std::operator<<(poVar1,local_30);
  std::__cxx11::string::~string(local_30);
  poVar1 = std::operator<<(local_10,", ");
  poVar1 = std::operator<<(poVar1,"unit=");
  duckdb_apache::thrift::to_string<duckdb_parquet::TimeUnit>(in_stack_00000118);
  std::operator<<(poVar1,local_60);
  std::__cxx11::string::~string(local_60);
  std::operator<<(local_10,")");
  return;
}

Assistant:

void TimestampType::printTo(std::ostream& out) const {
  using ::apache::thrift::to_string;
  out << "TimestampType(";
  out << "isAdjustedToUTC=" << to_string(isAdjustedToUTC);
  out << ", " << "unit=" << to_string(unit);
  out << ")";
}